

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

Pubkey * cfd::core::SchnorrUtil::ComputeSigPointBatch
                   (Pubkey *__return_storage_ptr__,
                   vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *msgs,
                   vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                   *nonces,SchnorrPubkey *pubkey)

{
  pointer pBVar1;
  pointer pBVar2;
  CfdException *this;
  ulong uVar3;
  long lVar4;
  ByteData256 *this_00;
  initializer_list<cfd::core::Pubkey> __l;
  allocator local_1b1;
  Pubkey xe;
  undefined1 local_198 [48];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_150;
  Privkey res;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  ByteData bip340_challenge;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  ByteData256 *local_d0;
  vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *local_c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  Pubkey rs;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  pBVar1 = (msgs->
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (msgs->
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_150 = msgs;
  if ((pBVar1 != pBVar2) && ((long)pBVar1 - (long)pBVar2 == *(long *)(nonces + 8) - *(long *)nonces)
     ) {
    Pubkey::Pubkey(&rs);
    local_c8 = nonces;
    if ((long)(local_150->
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(local_150->
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
              _M_impl.super__Vector_impl_data._M_start == 0x18) {
      ::std::__cxx11::string::string((string *)local_198,"02",(allocator *)&local_168);
      ByteData::ByteData(&bip340_challenge,(string *)local_198);
      ByteData256::GetData(&xe.data_,*(ByteData256 **)nonces);
      ByteData::Concat<cfd::core::ByteData>((ByteData *)&local_60,&bip340_challenge,&xe.data_);
      Pubkey::Pubkey((Pubkey *)&res,(ByteData *)&local_60);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rs,&res);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&res);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xe);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bip340_challenge);
      ::std::__cxx11::string::~string((string *)local_198);
    }
    else {
      res.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      res.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      res.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0 = *(ByteData256 **)(nonces + 8);
      for (this_00 = *(ByteData256 **)nonces; this_00 != local_d0; this_00 = this_00 + 1) {
        ::std::__cxx11::string::string((string *)local_198,"02",(allocator *)&local_128);
        ByteData::ByteData((ByteData *)&xe,(string *)local_198);
        ByteData256::GetData((ByteData *)&local_168,this_00);
        ByteData::Concat<cfd::core::ByteData>
                  ((ByteData *)&local_48,(ByteData *)&xe,(ByteData *)&local_168);
        Pubkey::Pubkey((Pubkey *)&bip340_challenge,(ByteData *)&local_48);
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
        emplace_back<cfd::core::Pubkey>
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&res,
                   (Pubkey *)&bip340_challenge);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bip340_challenge)
        ;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48)
        ;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&local_168);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xe);
        ::std::__cxx11::string::~string((string *)local_198);
      }
      Pubkey::CombinePubkey
                ((Pubkey *)local_198,
                 (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&res);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rs,
                 (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_198);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_198);
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&res);
    }
    ::std::__cxx11::string::string
              ((string *)local_198,
               "7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c"
               ,(allocator *)&res);
    ByteData::ByteData(&bip340_challenge,(string *)local_198);
    ::std::__cxx11::string::~string((string *)local_198);
    Privkey::Privkey(&res);
    lVar4 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)(((long)(local_150->
                               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_150->
                              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1
        ) {
      ByteData256::GetData((ByteData *)&local_c0,(ByteData256 *)(*(long *)local_c8 + lVar4));
      ByteData::Concat<cfd::core::ByteData>
                ((ByteData *)&local_128,&bip340_challenge,(ByteData *)&local_c0);
      ByteData256::GetData((ByteData *)&local_e8,&pubkey->data_);
      ByteData::Concat<cfd::core::ByteData>
                ((ByteData *)&local_168,(ByteData *)&local_128,(ByteData *)&local_e8);
      ByteData::Concat<cfd::core::ByteData256>
                ((ByteData *)local_198,(ByteData *)&local_168,
                 (ByteData256 *)
                 ((long)&(((local_150->
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           )._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar4));
      HashUtil::Sha256((ByteData256 *)&xe,(ByteData *)local_198);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_198);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_168);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
      if (uVar3 == 0) {
        Privkey::Privkey((Privkey *)local_198,(ByteData256 *)&xe,kMainnet,true);
      }
      else {
        Privkey::CreateTweakAdd((Privkey *)local_198,&res,(ByteData256 *)&xe);
      }
      Privkey::operator=(&res,(Privkey *)local_198);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_198);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xe);
      lVar4 = lVar4 + 0x18;
    }
    ::std::__cxx11::string::string((string *)local_198,"02",&local_1b1);
    ByteData::ByteData((ByteData *)&local_128,(string *)local_198);
    ByteData256::GetData((ByteData *)&local_c0,&pubkey->data_);
    ByteData::Concat<cfd::core::ByteData>
              ((ByteData *)&local_78,(ByteData *)&local_128,(ByteData *)&local_c0);
    Pubkey::Pubkey((Pubkey *)&local_168,(ByteData *)&local_78);
    Privkey::GetData((ByteData *)&local_90,&res);
    ByteData256::ByteData256((ByteData256 *)&local_e8,(ByteData *)&local_90);
    Pubkey::CreateTweakMul(&xe,(Pubkey *)&local_168,(ByteData256 *)&local_e8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_168);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    ::std::__cxx11::string::~string((string *)local_198);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_198,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rs);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_198 + 0x18),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xe);
    __l._M_len = 2;
    __l._M_array = (iterator)local_198;
    ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_168,__l,
               (allocator_type *)&local_128);
    Pubkey::CombinePubkey
              (__return_storage_ptr__,
               (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_168);
    ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_168);
    lVar4 = 0x18;
    do {
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_198 + lVar4))
      ;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xe);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&res);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bip340_challenge);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&rs);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_198,
             "Expected same number of messages or nonces, and at least one message.",
             (allocator *)&res);
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_198);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey SchnorrUtil::ComputeSigPointBatch(
    const std::vector<ByteData256> &msgs,
    const std::vector<SchnorrPubkey> &nonces, const SchnorrPubkey &pubkey) {
  if (msgs.size() != nonces.size() || msgs.empty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Expected same number of messages or nonces, and at least one "
        "message.");
  }

  Pubkey rs;

  if (msgs.size() == 1) {
    rs = Pubkey(ByteData("02").Concat(nonces[0].GetData()));
  } else {
    std::vector<Pubkey> pub_nonces;
    for (const auto &nonce : nonces) {
      pub_nonces.push_back(Pubkey(ByteData("02").Concat(nonce.GetData())));
    }
    rs = Pubkey::CombinePubkey(pub_nonces);
  }

  auto bip340_challenge = ByteData(
      "7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c7bb52d7"
      "a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c");
  Privkey res;
  for (size_t i = 0; i < msgs.size(); i++) {
    auto m_tagged_hash =
        HashUtil::Sha256(bip340_challenge.Concat(nonces[i].GetData())
                             .Concat(pubkey.GetData())
                             .Concat(msgs[i]));
    if (i == 0) {
      res = Privkey(m_tagged_hash);
    } else {
      res = res.CreateTweakAdd(m_tagged_hash);
    }
  }

  auto xe = Pubkey(ByteData("02").Concat(pubkey.GetData()))
                .CreateTweakMul(ByteData256(res.GetData()));

  return Pubkey::CombinePubkey({rs, xe});
}